

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

int32 hash_table_lookup_bkey(hash_table_t *h,char *key,size_t len,void **val)

{
  uint32 hash_00;
  char *key_00;
  hash_entry_t *phVar1;
  char *str;
  uint32 hash;
  hash_entry_t *entry;
  void **val_local;
  size_t len_local;
  char *key_local;
  hash_table_t *h_local;
  
  key_00 = makekey((uint8 *)key,len,(char *)0x0);
  hash_00 = key2hash(h,key_00);
  ckd_free(key_00);
  phVar1 = lookup(h,hash_00,key,len);
  if (phVar1 == (hash_entry_t *)0x0) {
    h_local._4_4_ = -1;
  }
  else {
    if (val != (void **)0x0) {
      *val = phVar1->val;
    }
    h_local._4_4_ = 0;
  }
  return h_local._4_4_;
}

Assistant:

int32
hash_table_lookup_bkey(hash_table_t * h, const char *key, size_t len, void ** val)
{
    hash_entry_t *entry;
    uint32 hash;
    char *str;

    str = makekey((uint8 *) key, len, NULL);
    hash = key2hash(h, str);
    ckd_free(str);

    entry = lookup(h, hash, key, len);
    if (entry) {
        if (val)
            *val = entry->val;
        return 0;
    }
    else
        return -1;
}